

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

OSToken * OSToken::accessToken(string *basePath,string *tokenDir,int umask)

{
  OSToken *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = (OSToken *)operator_new(0xe8);
  std::operator+(&local_60,basePath,"/");
  std::operator+(&local_40,&local_60,tokenDir);
  OSToken(this,&local_40,umask);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return this;
}

Assistant:

OSToken *OSToken::accessToken(const std::string &basePath, const std::string &tokenDir, int umask)
{
	return new OSToken(basePath + OS_PATHSEP + tokenDir, umask);
}